

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

bool InitEthernet(AmpIO *Board,uint eth_port)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  ostream *poVar4;
  void *pvVar5;
  uint local_44;
  ushort local_2c;
  ushort local_2a;
  ushort local_28;
  uint16_t uStack_26;
  uint8_t portStatus;
  uint16_t regHigh;
  uint16_t regMid;
  uint16_t regLow;
  uint16_t chipID;
  uint32_t status;
  uint fpga_ver;
  uint eth_port_local;
  AmpIO *Board_local;
  
  status = eth_port;
  _fpga_ver = Board;
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  if (uVar3 < 5) {
    poVar4 = std::operator<<((ostream *)&std::cout,"   No Ethernet controller, firmware version = ")
    ;
    uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)_fpga_ver);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    Board_local._7_1_ = false;
  }
  else {
    _regLow = BoardIO::GetFpgaVersionMajor((BoardIO *)_fpga_ver);
    if (_regLow < 2) {
      poVar4 = std::operator<<((ostream *)&std::cout,"   No Ethernet in FPGA V");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,_regLow);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      Board_local._7_1_ = false;
    }
    else {
      PrintEthernetStatus(_fpga_ver);
      FpgaIO::WriteEthernetPhyReset(&_fpga_ver->super_FpgaIO,status);
      if (_regLow == 2) {
        Amp1394_Sleep(0.1);
      }
      else {
        Amp1394_Sleep(0.5);
      }
      FpgaIO::ReadEthernetStatus(&_fpga_ver->super_FpgaIO,(uint32_t *)&regHigh);
      poVar4 = std::operator<<((ostream *)&std::cout,"   After reset, status = ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
      if (_regLow == 2) {
        local_44 = _regHigh >> 0x10;
      }
      else {
        local_44 = _regHigh;
      }
      pvVar5 = (void *)std::ostream::operator<<(pvVar5,local_44);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      if (_regLow == 2) {
        if ((_regHigh & 0x20000000) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"   Ethernet V2 failed initialization");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          EthBasePort::PrintStatus((ostream *)&std::cout,_regHigh);
          return false;
        }
        uStack_26 = FpgaIO::ReadKSZ8851ChipID(&_fpga_ver->super_FpgaIO);
        poVar4 = std::operator<<((ostream *)&std::cout,"   Chip ID = ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
        pvVar5 = (void *)std::ostream::operator<<(pvVar5,uStack_26);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        if ((uStack_26 & 0xfff0) != 0x8870) {
          return false;
        }
        bVar1 = CheckEthernetV2(_fpga_ver);
        if (!bVar1) {
          PrintEthernetStatus(_fpga_ver);
          return false;
        }
        FpgaIO::ReadKSZ8851Reg(&_fpga_ver->super_FpgaIO,'\x10',&local_28);
        FpgaIO::ReadKSZ8851Reg(&_fpga_ver->super_FpgaIO,'\x12',&local_2a);
        FpgaIO::ReadKSZ8851Reg(&_fpga_ver->super_FpgaIO,'\x14',&local_2c);
        poVar4 = std::operator<<((ostream *)&std::cout,"   MAC address = ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar5,local_2c);
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2a);
        poVar4 = std::operator<<(poVar4,":");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_28);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      else if (_regLow == 3) {
        bVar2 = FpgaIO::GetEthernetPortStatusV3(_regHigh,status);
        if ((bVar2 & 0x80) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"   Ethernet V3 failed initialization");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          EthBasePort::PrintStatus((ostream *)&std::cout,_regHigh);
          return false;
        }
        bVar1 = CheckEthernetV3(_fpga_ver,status);
        if (!bVar1) {
          PrintEthernetStatus(_fpga_ver);
          return false;
        }
      }
      Amp1394_Sleep(2.5);
      Board_local._7_1_ = true;
    }
  }
  return Board_local._7_1_;
}

Assistant:

bool InitEthernet(AmpIO &Board, unsigned int eth_port)
{
    if (Board.GetFirmwareVersion() < 5) {
        std::cout << "   No Ethernet controller, firmware version = " << Board.GetFirmwareVersion() << std::endl;
        return false;
    }

    unsigned int fpga_ver = Board.GetFpgaVersionMajor();
    if (fpga_ver < 2) {
        std::cout << "   No Ethernet in FPGA V" << fpga_ver << std::endl;
        return false;
    }
    PrintEthernetStatus(Board);

    // Reset the board
    Board.WriteEthernetPhyReset(eth_port);
    if (fpga_ver == 2) {
        // Wait 100 msec
        Amp1394_Sleep(0.1);
    }
    else {
        // Wait 500 msec
        Amp1394_Sleep(0.5);
    }

    // Read the status
    uint32_t status;
    Board.ReadEthernetStatus(status);
    std::cout << "   After reset, status = " << std::hex << ((fpga_ver == 2) ? (status>>16) : status) << std::endl;

    if (fpga_ver == 2) {
        if (!(status & FpgaIO::ETH_STAT_INIT_OK_V2)) {
            std::cout << "   Ethernet V2 failed initialization" << std::endl;
            EthBasePort::PrintStatus(std::cout, status);
            return false;
        }

        // Read the Chip ID (16-bit read)
        uint16_t chipID = Board.ReadKSZ8851ChipID();
        std::cout << "   Chip ID = " << std::hex << chipID << std::endl;
        if ((chipID&0xfff0) != 0x8870)
            return false;


        // Check that KSZ8851 registers are as expected
        if (!CheckEthernetV2(Board)) {
            PrintEthernetStatus(Board);
            return false;
        }

        // Display the MAC address
        uint16_t regLow, regMid, regHigh;
        Board.ReadKSZ8851Reg(0x10, regLow);   // MAC address low = 0x94nn (nn = board id)
        Board.ReadKSZ8851Reg(0x12, regMid);   // MAC address middle = 0xOE13
        Board.ReadKSZ8851Reg(0x14, regHigh);  // MAC address high = 0xFA61
        std::cout << "   MAC address = " << std::hex << regHigh << ":" << regMid << ":" << regLow << std::endl;
    }
    else if (fpga_ver == 3) {
        uint8_t portStatus = FpgaIO::GetEthernetPortStatusV3(status, eth_port);
        if (!(portStatus & FpgaIO::ETH_PORT_STAT_INIT_OK)) {
            std::cout << "   Ethernet V3 failed initialization" << std::endl;
            EthBasePort::PrintStatus(std::cout, status);
            return false;
        }

        // Check that RTL8211F registers are as expected
        if (!CheckEthernetV3(Board, eth_port)) {
            PrintEthernetStatus(Board);
            return false;
        }
    }

    // Wait 2.5 sec
    Amp1394_Sleep(2.5);
    return true;
}